

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

_Bool inlist(curl_slist *head,char *checkfor)

{
  int iVar1;
  size_t sVar2;
  size_t thislen;
  char *checkfor_local;
  curl_slist *head_local;
  
  sVar2 = strlen(checkfor);
  checkfor_local = (char *)head;
  while( true ) {
    if (checkfor_local == (char *)0x0) {
      return false;
    }
    iVar1 = curl_strnequal(*(undefined8 *)checkfor_local,checkfor,sVar2);
    if ((iVar1 != 0) &&
       ((*(char *)(*(long *)checkfor_local + sVar2) == ':' ||
        (*(char *)(*(long *)checkfor_local + sVar2) == ';')))) break;
    checkfor_local = *(char **)(checkfor_local + 8);
  }
  return true;
}

Assistant:

static bool inlist(const struct curl_slist *head,
                   const char *checkfor)
{
  size_t thislen = strlen(checkfor);
  DEBUGASSERT(thislen);
  DEBUGASSERT(checkfor[thislen-1] != ':');

  for(; head; head = head->next) {
    if(curl_strnequal(head->data, checkfor, thislen) &&
       isheadersep(head->data[thislen]) )
      return TRUE;
  }

  return FALSE;
}